

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void statement(LexState *ls)

{
  unsigned_short *puVar1;
  byte bVar2;
  byte bVar3;
  FuncState *fs;
  Dyndata *pDVar4;
  Instruction *pIVar5;
  expkind list;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint first;
  TString *pTVar10;
  TString *pTVar11;
  long lVar12;
  ushort uVar13;
  Labeldesc *pLVar14;
  uint uVar15;
  char *pcVar16;
  FuncState *pFVar17;
  Labellist *l;
  expdesc v;
  undefined1 local_78 [8];
  expdesc local_70;
  uint local_54;
  FuncState *local_50;
  undefined1 local_48 [16];
  byte local_38;
  undefined2 local_37;
  
  iVar8 = ls->linenumber;
  uVar13 = ls->L->nCcalls + 1;
  ls->L->nCcalls = uVar13;
  if (200 < uVar13) {
    errorlimit(ls->fs,200,"C levels");
  }
  iVar7 = (ls->t).token;
  switch(iVar7) {
  case 0x102:
  case 0x10a:
    iVar8 = luaK_jump(ls->fs);
    gotostat(ls,iVar8);
    break;
  case 0x103:
    luaX_next(ls);
    block(ls);
    check_match(ls,0x106,0x103,iVar8);
    break;
  case 0x108:
    pFVar17 = ls->fs;
    local_38 = pFVar17->nactvar;
    pDVar4 = pFVar17->ls->dyd;
    local_48._8_4_ = (pDVar4->label).n;
    local_48._12_4_ = (pDVar4->gt).n;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\x01';
    local_48._0_8_ = pFVar17->bl;
    pFVar17->bl = (BlockCnt *)local_48;
    luaX_next(ls);
    pTVar11 = str_checkname(ls);
    iVar7 = (ls->t).token;
    if ((iVar7 == 0x2c) || (iVar7 == 0x10c)) {
      local_50 = ls->fs;
      local_54 = (uint)local_50->freereg;
      pTVar10 = luaX_newstring(ls,"(for generator)",0xf);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for state)",0xb);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for control)",0xd);
      new_localvar(ls,pTVar10);
      new_localvar(ls,pTVar11);
      iVar7 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar11 = str_checkname(ls);
        new_localvar(ls,pTVar11);
        iVar7 = iVar7 + 1;
      }
      checknext(ls,0x10c);
      iVar6 = ls->linenumber;
      iVar9 = explist(ls,(expdesc *)local_78);
      adjust_assign(ls,3,iVar9,(expdesc *)local_78);
      luaK_checkstack(local_50,3);
      iVar9 = 0;
      uVar15 = local_54;
    }
    else {
      if (iVar7 != 0x3d) {
        pcVar16 = "\'=\' or \'in\' expected";
        goto LAB_00113141;
      }
      fs = ls->fs;
      bVar2 = fs->freereg;
      pTVar10 = luaX_newstring(ls,"(for index)",0xb);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for limit)",0xb);
      new_localvar(ls,pTVar10);
      pTVar10 = luaX_newstring(ls,"(for step)",10);
      new_localvar(ls,pTVar10);
      new_localvar(ls,pTVar11);
      checknext(ls,0x3d);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      checknext(ls,0x2c);
      subexpr(ls,(expdesc *)local_78,0);
      luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      if ((ls->t).token == 0x2c) {
        luaX_next(ls);
        subexpr(ls,(expdesc *)local_78,0);
        luaK_exp2nextreg(ls->fs,(expdesc *)local_78);
      }
      else {
        bVar3 = fs->freereg;
        iVar7 = luaK_intK(fs,1);
        luaK_codek(fs,(uint)bVar3,iVar7);
        luaK_reserveregs(fs,1);
      }
      iVar7 = 1;
      iVar9 = 1;
      uVar15 = (uint)bVar2;
      iVar6 = iVar8;
    }
    forbody(ls,uVar15,iVar6,iVar7,iVar9);
    check_match(ls,0x106,0x108,iVar8);
    goto LAB_0011309d;
  case 0x109:
    luaX_next(ls);
    singlevar(ls,(expdesc *)local_78);
    while (iVar7 = (ls->t).token, iVar7 == 0x2e) {
      fieldsel(ls,(expdesc *)local_78);
    }
    if (iVar7 == 0x3a) {
      fieldsel(ls,(expdesc *)local_78);
    }
    body(ls,(expdesc *)local_48,(uint)(iVar7 == 0x3a),iVar8);
    luaK_storevar(ls->fs,(expdesc *)local_78,(expdesc *)local_48);
    luaK_fixline(ls->fs,iVar8);
    break;
  case 0x10b:
    pFVar17 = ls->fs;
    local_78._0_4_ = 0xffffffff;
    do {
      test_then_block(ls,(int *)local_78);
      iVar7 = (ls->t).token;
    } while (iVar7 == 0x105);
    if (iVar7 == 0x104) {
      luaX_next(ls);
      block(ls);
    }
    check_match(ls,0x106,0x10b,iVar8);
    list = local_78._0_4_;
    goto LAB_00112d4e;
  case 0x10d:
    luaX_next(ls);
    if ((ls->t).token == 0x109) {
      luaX_next(ls);
      pFVar17 = ls->fs;
      pTVar11 = str_checkname(ls);
      new_localvar(ls,pTVar11);
      adjustlocalvars(ls,1);
      body(ls,(expdesc *)local_78,0,ls->linenumber);
      pFVar17->f->locvars
      [(pFVar17->ls->dyd->actvar).arr[(long)pFVar17->firstlocal + (long)(int)local_70.k].idx].
      startpc = pFVar17->pc;
    }
    else {
      pTVar11 = str_checkname(ls);
      new_localvar(ls,pTVar11);
      iVar8 = 1;
      while ((ls->t).token == 0x2c) {
        luaX_next(ls);
        pTVar11 = str_checkname(ls);
        new_localvar(ls,pTVar11);
        iVar8 = iVar8 + 1;
      }
      if ((ls->t).token == 0x3d) {
        luaX_next(ls);
        iVar7 = explist(ls,(expdesc *)local_78);
      }
      else {
        local_78 = (undefined1  [8])((ulong)local_78 & 0xffffffff00000000);
        iVar7 = 0;
      }
      adjust_assign(ls,iVar8,iVar7,(expdesc *)local_78);
      adjustlocalvars(ls,iVar8);
    }
    break;
  case 0x111:
    pFVar17 = ls->fs;
    iVar7 = luaK_getlabel(pFVar17);
    local_70.u.ival._0_3_ = 0x10000;
    local_38 = pFVar17->nactvar;
    pDVar4 = pFVar17->ls->dyd;
    local_70.k = (pDVar4->label).n;
    local_70._4_4_ = (pDVar4->gt).n;
    local_70.u.ival._1_1_ = 0;
    local_70.u.ival._0_1_ = local_38;
    local_78 = (undefined1  [8])pFVar17->bl;
    pFVar17->bl = (BlockCnt *)local_78;
    local_37._0_1_ = '\0';
    local_37._1_1_ = '\0';
    pFVar17->bl = (BlockCnt *)local_48;
    local_48._0_8_ = (BlockCnt *)local_78;
    local_48._8_4_ = local_70.k;
    local_48._12_4_ = local_70._4_4_;
    luaX_next(ls);
    statlist(ls);
    check_match(ls,0x115,0x111,iVar8);
    iVar8 = cond(ls);
    if ((lu_byte)local_37 != '\0') {
      luaK_patchclose(pFVar17,iVar8,(uint)local_38);
    }
    leaveblock(pFVar17);
    luaK_patchlist(pFVar17,iVar8,iVar7);
LAB_0011309d:
    leaveblock(pFVar17);
    break;
  case 0x112:
    luaX_next(ls);
    iVar8 = (ls->t).token;
    uVar15 = iVar8 - 0x104;
    pFVar17 = ls->fs;
    first = 0;
    if (iVar8 == 0x3b) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      first = 0;
      if ((uVar15 < 0x1e & (byte)(0x20020007 >> ((byte)uVar15 & 0x1f))) == 0) {
        iVar8 = explist(ls,(expdesc *)local_78);
        if (local_78._0_4_ - VCALL < 2) {
          luaK_setreturns(pFVar17,(expdesc *)local_78,-1);
          if (iVar8 == 1 && local_78._0_4_ == VCALL) {
            pIVar5 = pFVar17->f->code;
            pIVar5[(int)local_70.k] = pIVar5[(int)local_70.k] & 0xffffffc0 | 0x25;
          }
          first = (uint)pFVar17->nactvar;
          iVar8 = -1;
        }
        else if (iVar8 == 1) {
          first = luaK_exp2anyreg(pFVar17,(expdesc *)local_78);
          iVar8 = 1;
        }
        else {
          luaK_exp2nextreg(pFVar17,(expdesc *)local_78);
          first = (uint)pFVar17->nactvar;
        }
      }
    }
    luaK_ret(pFVar17,first,iVar8);
    if ((ls->t).token != 0x3b) break;
LAB_001130c4:
    luaX_next(ls);
    break;
  case 0x116:
    pFVar17 = ls->fs;
    luaX_next(ls);
    iVar7 = luaK_getlabel(pFVar17);
    list = cond(ls);
    local_70.u.ival._0_3_ = 0x10000;
    pDVar4 = pFVar17->ls->dyd;
    local_70.k = (pDVar4->label).n;
    local_70._4_4_ = (pDVar4->gt).n;
    local_70.u.ival._1_1_ = 0;
    local_70.u.ival._0_1_ = pFVar17->nactvar;
    local_78 = (undefined1  [8])pFVar17->bl;
    pFVar17->bl = (BlockCnt *)local_78;
    checknext(ls,0x103);
    block(ls);
    iVar6 = luaK_jump(pFVar17);
    luaK_patchlist(pFVar17,iVar6,iVar7);
    check_match(ls,0x106,0x116,iVar8);
    leaveblock(pFVar17);
LAB_00112d4e:
    luaK_patchtohere(pFVar17,list);
    break;
  default:
    if (iVar7 == 0x120) {
      luaX_next(ls);
      pTVar11 = str_checkname(ls);
      pFVar17 = ls->fs;
      iVar7 = pFVar17->bl->firstlabel;
      iVar6 = (ls->dyd->label).n;
      l = &ls->dyd->label;
      if (iVar7 < iVar6) {
        lVar12 = (long)iVar6 - (long)iVar7;
        pLVar14 = l->arr + iVar7;
        do {
          if (pLVar14->name == pTVar11) {
            pcVar16 = luaO_pushfstring(pFVar17->ls->L,"label \'%s\' already defined on line %d",
                                       pTVar11 + 1,(ulong)(uint)pLVar14->line);
            semerror(pFVar17->ls,pcVar16);
          }
          pLVar14 = pLVar14 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      checknext(ls,0x120);
      iVar7 = luaK_getlabel(pFVar17);
      iVar8 = newlabelentry(ls,l,pTVar11,iVar8,iVar7);
      do {
        iVar7 = (ls->t).token;
        if (iVar7 < 0x120) {
          if (iVar7 != 0x3b) goto LAB_00112ef4;
        }
        else if (iVar7 != 0x120) {
          if (iVar7 != 0x121) goto LAB_00112f13;
          goto LAB_00112efe;
        }
        statement(ls);
      } while( true );
    }
    if (iVar7 == 0x3b) goto LAB_001130c4;
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x10c:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x113:
  case 0x114:
  case 0x115:
    pFVar17 = ls->fs;
    suffixedexp(ls,&local_70);
    iVar8 = (ls->t).token;
    if ((iVar8 == 0x3d) || (iVar8 == 0x2c)) {
      local_78 = (undefined1  [8])0x0;
      assignment(ls,(LHS_assign *)local_78,1);
    }
    else {
      if (local_70.k != VCALL) {
        pcVar16 = "syntax error";
LAB_00113141:
        luaX_syntaxerror(ls,pcVar16);
      }
      pIVar5 = pFVar17->f->code;
      pIVar5[local_70.u.info] = pIVar5[local_70.u.info] & 0xff803fff | 0x4000;
    }
  }
LAB_001130cc:
  ls->fs->freereg = ls->fs->nactvar;
  puVar1 = &ls->L->nCcalls;
  *puVar1 = *puVar1 - 1;
  return;
LAB_00112ef4:
  if (iVar7 - 0x104U < 3) {
LAB_00112efe:
    l->arr[iVar8].nactvar = pFVar17->bl->nactvar;
  }
LAB_00112f13:
  findgotos(ls,l->arr + iVar8);
  goto LAB_001130cc;
}

Assistant:

static void statement(LexState *ls) {
    int line = ls->linenumber;  /* may be needed for error messages */
    enterlevel(ls);
    switch (ls->t.token) {
        case ';': {  /* stat -> ';' (empty statement) */
            luaX_next(ls);  /* skip ';' */
            break;
        }
        case TK_IF: {  /* stat -> ifstat */
            ifstat(ls, line);
            break;
        }
        case TK_WHILE: {  /* stat -> whilestat */
            whilestat(ls, line);
            break;
        }
        case TK_DO: {  /* stat -> DO block END */
            luaX_next(ls);  /* skip DO */
            block(ls);
            check_match(ls, TK_END, TK_DO, line);
            break;
        }
        case TK_FOR: {  /* stat -> forstat */
            forstat(ls, line);
            break;
        }
        case TK_REPEAT: {  /* stat -> repeatstat */
            repeatstat(ls, line);
            break;
        }
        case TK_FUNCTION: {  /* stat -> funcstat */
            funcstat(ls, line);
            break;
        }
        case TK_LOCAL: {  /* stat -> localstat */
            luaX_next(ls);  /* skip LOCAL */
            if (testnext(ls, TK_FUNCTION))  /* local function? */
                localfunc(ls);
            else
                localstat(ls);
            break;
        }
        case TK_DBCOLON: {  /* stat -> label */
            luaX_next(ls);  /* skip double colon */
            labelstat(ls, str_checkname(ls), line);
            break;
        }
        case TK_RETURN: {  /* stat -> retstat */
            luaX_next(ls);  /* skip RETURN */
            retstat(ls);
            break;
        }
        case TK_BREAK:   /* stat -> breakstat */
        case TK_GOTO: {  /* stat -> 'goto' NAME */
            gotostat(ls, luaK_jump(ls->fs));
            break;
        }
        default: {  /* stat -> func | assignment */
            exprstat(ls);
            break;
        }
    }
    lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
               ls->fs->freereg >= ls->fs->nactvar);
    ls->fs->freereg = ls->fs->nactvar;  /* free registers */
    leavelevel(ls);
}